

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

pair<int,_int> __thiscall libtorrent::aux::parse_utf8_codepoint(aux *this,string_view str)

{
  byte bVar1;
  ulong uVar2;
  pair<int,_int> pVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  ulong uVar7;
  pair<int,_int> pVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar2 = 0xffffffff;
  if (this == (aux *)0x0) {
    pVar6.first = -1;
    pVar6.second = 0;
    return pVar6;
  }
  bVar1 = *(byte *)str._M_len;
  if (-1 < (long)(char)bVar1) {
    return (pair<int,_int>)((long)(char)bVar1 + 0x100000000);
  }
  uVar10 = (uint)bVar1;
  uVar11 = 2;
  if ((((uVar10 & 0xffffffe0) == 0xc0) || (uVar11 = 3, (bVar1 & 0xf0) == 0xe0)) ||
     (uVar11 = 4, (uVar10 & 0xfffffff8) == 0xf0)) {
    if ((int)this < (int)uVar11) {
      return (pair<int,_int>)((long)this << 0x20 | 0xffffffff);
    }
    uVar7 = (ulong)uVar11;
    uVar13 = 1;
    uVar10 = uVar10 & 0x70f1fU >> ((char)uVar11 * '\b' - 0x10U & 0x1f);
    do {
      uVar9 = uVar10;
      bVar1 = ((byte *)str._M_len)[uVar13];
      if (-0x41 < (char)bVar1) goto LAB_00389625;
      uVar12 = uVar9 << 6;
      uVar10 = bVar1 & 0x3f | uVar12;
      uVar13 = uVar13 + 1;
    } while (uVar7 != uVar13);
    if (uVar11 == 4) {
      if ((int)uVar10 < 0x10000) {
        pVar4.first = -1;
        pVar4.second = 4;
        return pVar4;
      }
    }
    else if (uVar11 == 3) {
      if ((int)uVar10 < 0x800) {
        pVar3.first = -1;
        pVar3.second = 3;
        return pVar3;
      }
    }
    else if ((int)uVar10 < 0x80) {
      pVar5.first = -1;
      pVar5.second = 2;
      return pVar5;
    }
    if (uVar12 < 0x110000) {
      uVar7 = uVar7 << 0x20;
      if ((uVar9 & 0x3ffffe0) != 0x360) {
        pVar8.second = uVar11;
        pVar8.first = uVar10;
        return pVar8;
      }
    }
    else {
LAB_00389625:
      uVar7 = uVar7 << 0x20;
    }
  }
  else {
    uVar7 = (ulong)((uVar10 & 0xfffffffc) == 0xf8) << 0x22;
    uVar2 = 0x1ffffffff;
  }
  return (pair<int,_int>)(uVar2 | uVar7);
}

Assistant:

std::pair<std::int32_t, int> parse_utf8_codepoint(string_view str)
	{
		TORRENT_ASSERT(!str.empty());
		if (str.empty()) return std::make_pair(-1, 0);

		int const sequence_len = utf8_sequence_length(str[0]);

		// this is likely the most common case
		if (sequence_len == 1) return std::make_pair(std::int32_t(str[0]), sequence_len);

		// if we find an invalid sequence length, skip one byte
		if (sequence_len == 0)
			return std::make_pair(-1, 1);

		if (sequence_len > 4)
			return std::make_pair(-1, sequence_len);

		if (sequence_len > int(str.size()))
			return std::make_pair(-1, static_cast<int>(str.size()));

		std::int32_t ch = 0;
		// first byte
		switch (sequence_len)
		{
			case 1:
				ch = str[0] & 0b01111111;
				break;
			case 2:
				ch = str[0] & 0b00011111;
				break;
			case 3:
				ch = str[0] & 0b00001111;
				break;
			case 4:
				ch = str[0] & 0b00000111;
				break;
		}
		for (int i = 1; i < sequence_len; ++i)
		{
			auto const b = static_cast<std::uint8_t>(str[static_cast<std::size_t>(i)]);
			// continuation bytes must start with 10xxxxxx
			if (b > 0b10111111 || b < 0b10000000)
				return std::make_pair(-1, sequence_len);
			ch <<= 6;
			ch += b & 0b111111;
		}

		// check if the sequence is overlong, i.e. whether it has leading
		// (redundant) zeros
		switch (sequence_len)
		{
			case 2:
				if (ch < 0x80) return std::make_pair(-1, sequence_len);
				break;
			case 3:
				if (ch < 0x800) return std::make_pair(-1, sequence_len);
				break;
			case 4:
				if (ch < 0x10000) return std::make_pair(-1, sequence_len);
				break;
		}

		if (ch > max_codepoint)
			return std::make_pair(-1, sequence_len);

		// per RFC 3629, surrogates should not appear in utf-8
		if (ch >= surrogate_start && ch <= surrogate_end)
			return std::make_pair(-1, sequence_len);

		return std::make_pair(static_cast<std::int32_t>(ch), sequence_len);
	}